

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Texture3D * __thiscall tcu::Texture3D::operator=(Texture3D *this,Texture3D *other)

{
  ConstPixelBufferAccess *pCVar1;
  int iVar2;
  
  if (this != other) {
    TextureLevelPyramid::operator=
              (&this->super_TextureLevelPyramid,&other->super_TextureLevelPyramid);
    iVar2 = other->m_height;
    this->m_width = other->m_width;
    this->m_height = iVar2;
    this->m_depth = other->m_depth;
    pCVar1 = &((this->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess;
    (this->m_view).m_numLevels =
         (int)(((long)(this->super_TextureLevelPyramid).m_access.
                      super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar1) / 0x28);
    (this->m_view).m_levels = pCVar1;
  }
  return this;
}

Assistant:

Texture3D& Texture3D::operator= (const Texture3D& other)
{
	if (this == &other)
		return *this;

	TextureLevelPyramid::operator=(other);

	m_width		= other.m_width;
	m_height	= other.m_height;
	m_depth		= other.m_depth;
	m_view		= Texture3DView(getNumLevels(), getLevels());

	return *this;
}